

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpCodeUtilAsmJs.cpp
# Opt level: O0

OpLayoutTypeAsmJs Js::OpCodeUtilAsmJs::GetOpCodeLayout(OpCodeAsmJs op)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  OpCodeAsmJs local_e;
  uint opIndex;
  OpCodeAsmJs op_local;
  
  local_e = op;
  if (op < InvalidOpCode) {
    bVar2 = operator<(&local_e,0xf8);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/OpCodeUtilAsmJs.cpp"
                                  ,0x42,"(op < (sizeof(*__countof_helper(OpCodeAsmJsLayouts)) + 0))"
                                  ,"op < _countof(OpCodeAsmJsLayouts)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    opIndex = *(uint *)(OpCodeAsmJsLayouts + (ulong)local_e * 4);
  }
  else {
    uVar3 = Js::operator+(MaxByteSizedOpcodes,1);
    uVar3 = Js::operator-(op,uVar3);
    if (0x171 < uVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/OpCodeUtilAsmJs.cpp"
                                  ,0x48,
                                  "(opIndex < (sizeof(*__countof_helper(ExtendedOpCodeAsmJsLayouts)) + 0))"
                                  ,"opIndex < _countof(ExtendedOpCodeAsmJsLayouts)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    opIndex = *(uint *)(ExtendedOpCodeAsmJsLayouts + (ulong)uVar3 * 4);
  }
  return (OpLayoutTypeAsmJs)opIndex;
}

Assistant:

OpLayoutTypeAsmJs OpCodeUtilAsmJs::GetOpCodeLayout(OpCodeAsmJs op)
    {
        if ((uint)op <= (uint)Js::OpCodeAsmJs::MaxByteSizedOpcodes)
        {
            Assert(op < _countof(OpCodeAsmJsLayouts));
            __analysis_assume(op < _countof(OpCodeAsmJsLayouts));
            return OpCodeAsmJsLayouts[(uint)op];
        }

        uint opIndex = op - (Js::OpCodeAsmJs::MaxByteSizedOpcodes + 1);
        Assert(opIndex < _countof(ExtendedOpCodeAsmJsLayouts));
        __analysis_assume(opIndex < _countof(ExtendedOpCodeAsmJsLayouts));
        return ExtendedOpCodeAsmJsLayouts[opIndex];
    }